

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void dumb_it_sr_get_channel_state(DUMB_IT_SIGRENDERER *sr,int channel,DUMB_IT_CHANNEL_STATE *state)

{
  int iVar1;
  uint uVar2;
  int *in_RDX;
  int in_ESI;
  DUMB_IT_SIGRENDERER *in_RDI;
  float fVar3;
  DUMB_IT_SIGDATA *unaff_retaddr;
  double delta;
  int t;
  IT_PLAYING *playing;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  IT_PLAYING *local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == (DUMB_IT_SIGRENDERER *)0x0) {
    in_RDX[1] = 0;
  }
  else {
    if (in_ESI < 0x40) {
      local_20 = in_RDI->channel[in_ESI].playing;
      if (local_20 == (IT_PLAYING *)0x0) {
        in_RDX[1] = 0;
        return;
      }
    }
    else {
      local_20 = in_RDI->playing[in_ESI + -0x40];
      if (local_20 == (IT_PLAYING *)0x0) {
        in_RDX[1] = 0;
        return;
      }
    }
    if ((local_20->flags & 8U) == 0) {
      *in_RDX = (int)(((long)local_20->channel - (long)in_RDI->channel) / 0xa0);
      in_RDX[1] = (uint)local_20->sampnum;
      fVar3 = calculate_volume(in_RDI,(IT_PLAYING *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                               (double)in_RDX);
      in_RDX[3] = (int)fVar3;
      iVar1 = apply_pan_envelope((IT_PLAYING *)
                                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      *(char *)(in_RDX + 4) = (char)((uint)(iVar1 + 0x80) >> 8);
      *(char *)((long)in_RDX + 0x11) = (char)iVar1;
      fVar3 = local_20->delta;
      uVar2 = (uint)local_20->filter_cutoff << 8;
      apply_pitch_modifications
                (unaff_retaddr,(IT_PLAYING *)in_RDI,
                 (double *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
      in_RDX[2] = (int)(fVar3 * 65536.0);
      if ((uVar2 == 0x7f00) && (local_20->filter_resonance == '\0')) {
        *(uchar *)(in_RDX + 5) = local_20->true_filter_resonance;
        uVar2 = (uint)local_20->true_filter_cutoff;
      }
      else {
        *(uchar *)(in_RDX + 5) = local_20->filter_resonance;
      }
      *(char *)((long)in_RDX + 0x12) = (char)(uVar2 >> 8);
      *(char *)((long)in_RDX + 0x13) = (char)uVar2;
    }
    else {
      in_RDX[1] = 0;
    }
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_it_sr_get_channel_state(DUMB_IT_SIGRENDERER *sr, int channel, DUMB_IT_CHANNEL_STATE *state)
{
	IT_PLAYING *playing;
	int t; /* temporary var for holding accurate pan and filter cutoff */
	double delta;
	ASSERT(channel < DUMB_IT_TOTAL_CHANNELS);
	if (!sr) { state->sample = 0; return; }
	if (channel >= DUMB_IT_N_CHANNELS) {
		playing = sr->playing[channel - DUMB_IT_N_CHANNELS];
		if (!playing) { state->sample = 0; return; }
	} else {
		playing = sr->channel[channel].playing;
		if (!playing) { state->sample = 0; return; }
	}

	if (playing->flags & IT_PLAYING_DEAD) { state->sample = 0; return; }

	state->channel = (int)(playing->channel - sr->channel);
	state->sample = playing->sampnum;
	state->volume = calculate_volume(sr, playing, 1.0f);

	t = apply_pan_envelope(playing);
	state->pan = (unsigned char)((t + 128) >> IT_ENVELOPE_SHIFT);
	state->subpan = (signed char)t;

	delta = playing->delta * 65536.0f;
	t = playing->filter_cutoff << IT_ENVELOPE_SHIFT;
	apply_pitch_modifications(sr->sigdata, playing, &delta, &t);
	state->freq = (int)delta;
	if (t == 127 << IT_ENVELOPE_SHIFT && playing->filter_resonance == 0) {
		state->filter_resonance = playing->true_filter_resonance;
		t = playing->true_filter_cutoff;
	} else
		state->filter_resonance = playing->filter_resonance;
	state->filter_cutoff = (unsigned char)(t >> 8);
	state->filter_subcutoff = (unsigned char)t;
}